

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

uint32_t decimalLength17(uint64_t v)

{
  uint64_t v_local;
  
  if (v < 100000000000000000) {
    if (v < 10000000000000000) {
      if (v < 1000000000000000) {
        if (v < 100000000000000) {
          if (v < 10000000000000) {
            if (v < 1000000000000) {
              if (v < 100000000000) {
                if (v < 10000000000) {
                  if (v < 1000000000) {
                    if (v < 100000000) {
                      if (v < 10000000) {
                        if (v < 1000000) {
                          if (v < 100000) {
                            if (v < 10000) {
                              if (v < 1000) {
                                if (v < 100) {
                                  if (v < 10) {
                                    v_local._4_4_ = 1;
                                  }
                                  else {
                                    v_local._4_4_ = 2;
                                  }
                                }
                                else {
                                  v_local._4_4_ = 3;
                                }
                              }
                              else {
                                v_local._4_4_ = 4;
                              }
                            }
                            else {
                              v_local._4_4_ = 5;
                            }
                          }
                          else {
                            v_local._4_4_ = 6;
                          }
                        }
                        else {
                          v_local._4_4_ = 7;
                        }
                      }
                      else {
                        v_local._4_4_ = 8;
                      }
                    }
                    else {
                      v_local._4_4_ = 9;
                    }
                  }
                  else {
                    v_local._4_4_ = 10;
                  }
                }
                else {
                  v_local._4_4_ = 0xb;
                }
              }
              else {
                v_local._4_4_ = 0xc;
              }
            }
            else {
              v_local._4_4_ = 0xd;
            }
          }
          else {
            v_local._4_4_ = 0xe;
          }
        }
        else {
          v_local._4_4_ = 0xf;
        }
      }
      else {
        v_local._4_4_ = 0x10;
      }
    }
    else {
      v_local._4_4_ = 0x11;
    }
    return v_local._4_4_;
  }
  __assert_fail("v < 100000000000000000L",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/membuf.c"
                ,0x35e,"uint32_t decimalLength17(const uint64_t)");
}

Assistant:

static inline uint32_t decimalLength17(const uint64_t v) {
	// This is slightly faster than a loop.
	// The average output length is 16.38 digits, so we check high-to-low.
	// Function precondition: v is not an 18, 19, or 20-digit number.
	// (17 digits are sufficient for round-tripping.)
	assert(v < 100000000000000000L);
	if (v >= 10000000000000000L) { return 17; }
	if (v >= 1000000000000000L) { return 16; }
	if (v >= 100000000000000L) { return 15; }
	if (v >= 10000000000000L) { return 14; }
	if (v >= 1000000000000L) { return 13; }
	if (v >= 100000000000L) { return 12; }
	if (v >= 10000000000L) { return 11; }
	if (v >= 1000000000L) { return 10; }
	if (v >= 100000000L) { return 9; }
	if (v >= 10000000L) { return 8; }
	if (v >= 1000000L) { return 7; }
	if (v >= 100000L) { return 6; }
	if (v >= 10000L) { return 5; }
	if (v >= 1000L) { return 4; }
	if (v >= 100L) { return 3; }
	if (v >= 10L) { return 2; }
	return 1;
}